

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storage.c
# Opt level: O0

Filename * read_setting_filename(settings_r *handle,char *name)

{
  char *str;
  Filename *ret;
  char *tmp;
  char *name_local;
  settings_r *handle_local;
  
  str = read_setting_s(handle,name);
  if (str == (char *)0x0) {
    handle_local = (settings_r *)0x0;
  }
  else {
    handle_local = (settings_r *)filename_from_str(str);
    safefree(str);
  }
  return (Filename *)handle_local;
}

Assistant:

Filename *read_setting_filename(settings_r *handle, const char *name)
{
    char *tmp = read_setting_s(handle, name);
    if (tmp) {
        Filename *ret = filename_from_str(tmp);
        sfree(tmp);
        return ret;
    } else
        return NULL;
}